

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O0

void summarize_cure(int tmd,effect_object_property **summaries,int *unsummarized_count)

{
  timed_failure *local_28;
  timed_failure *f;
  int *unsummarized_count_local;
  effect_object_property **summaries_local;
  int tmd_local;
  
  for (local_28 = timed_effects[tmd].fail; local_28 != (timed_failure *)0x0;
      local_28 = local_28->next) {
    if (local_28->code == 1) {
      add_to_summaries(summaries,local_28->idx,0,0,EFPROP_CURE_FLAG);
    }
    else if (local_28->code == 2) {
      add_to_summaries(summaries,local_28->idx,0x51,200,EFPROP_CURE_RESIST);
    }
    else {
      *unsummarized_count = *unsummarized_count + 1;
    }
  }
  return;
}

Assistant:

static void summarize_cure(int tmd, struct effect_object_property **summaries,
		int *unsummarized_count)
{
	const struct timed_failure *f = timed_effects[tmd].fail;

	while (f) {
		if (f->code == TMD_FAIL_FLAG_OBJECT) {
			add_to_summaries(summaries, f->idx, 0, 0,
				EFPROP_CURE_FLAG);
		} else if (f->code == TMD_FAIL_FLAG_RESIST) {
			add_to_summaries(summaries, f->idx,
				RES_LEVEL_EFFECT + 1, RES_LEVEL_MIN,
				EFPROP_CURE_RESIST);
		} else {
			++*unsummarized_count;
		}
		f = f->next;
	}
}